

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void __thiscall CVmRun::throw_new_rtesub(CVmRun *this,vm_obj_id_t cls,uint argc,int errnum)

{
  vm_obj_id_t in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  CVmRun *in_RDI;
  int32_t in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe8;
  
  if (in_ESI != 0) {
    push_int(in_RDI,in_stack_ffffffffffffffdc);
    throw_new_class((CVmRun *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
                    (char *)in_RDI);
  }
  err_throw(0);
}

Assistant:

void CVmRun::throw_new_rtesub(VMG_ vm_obj_id_t cls, uint argc, int errnum)
{
    /* if the subclass is defined, create an instance and throw it */
    if (cls != VM_INVALID_OBJ)
    {
        /* push the error number as the first argument */
        push_int(vmg_ errnum);

        /* throw the subclass error */
        throw_new_class(vmg_ cls, argc + 1, 0);
    }

    /* the subclass isn't defined, so throw a generic RuntimeError */
    err_throw(errnum);
}